

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O2

void combine_iteration_histograms
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *iteration_histograms_per_thread,
               vector<int,_std::allocator<int>_> *combined_iterations_histogram)

{
  pointer __src;
  pointer pvVar1;
  size_t __n;
  pointer pvVar2;
  pointer pvVar3;
  
  pvVar2 = (iteration_histograms_per_thread->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __src = (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start;
  __n = (long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove((combined_iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start,__src,__n);
    pvVar2 = (iteration_histograms_per_thread->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  pvVar1 = (iteration_histograms_per_thread->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while (pvVar3 = pvVar2 + 1, pvVar3 != pvVar1) {
    std::
    transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<void>>
              ((pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               pvVar2[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (combined_iterations_histogram->super__Vector_base<int,_std::allocator<int>_>).
               _M_impl.super__Vector_impl_data._M_start);
    pvVar2 = pvVar3;
  }
  return;
}

Assistant:

void combine_iteration_histograms(const std::vector<std::vector<int>>& iteration_histograms_per_thread, std::vector<int>& combined_iterations_histogram)
{
    std::copy(iteration_histograms_per_thread.front().cbegin(), iteration_histograms_per_thread.front().cend(), combined_iterations_histogram.begin());

    std::for_each(std::next(iteration_histograms_per_thread.cbegin()), iteration_histograms_per_thread.cend(), [&](auto& hist) {
        std::transform(hist.cbegin(), hist.cend(), combined_iterations_histogram.cbegin(), combined_iterations_histogram.begin(), std::plus<>{});
    });
}